

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O2

bool __thiscall
QSqlRelationalTableModel::removeColumns
          (QSqlRelationalTableModel *this,int column,int count,QModelIndex *parent)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  
  lVar1 = *(long *)(this + 8);
  bVar2 = QModelIndex::isValid(parent);
  if (-1 < column && !bVar2) {
    iVar3 = QSqlRecord::count((QSqlRecord *)(lVar1 + 0x100));
    if (column + count <= iVar3) {
      iVar3 = 0;
      if (0 < count) {
        iVar3 = count;
      }
      while (bVar2 = iVar3 != 0, iVar3 = iVar3 + -1, bVar2) {
        QSqlRecord::remove((QSqlRecord *)(lVar1 + 0x300),(char *)(ulong)(uint)column);
        if ((char *)(ulong)(uint)column < *(char **)(lVar1 + 0x2f8)) {
          QList<QSharedPointer<QRelation>_>::remove
                    ((QList<QSharedPointer<QRelation>_> *)(lVar1 + 0x2e8),
                     (char *)(ulong)(uint)column);
        }
      }
      bVar2 = QSqlTableModel::removeColumns((QSqlTableModel *)this,column,count,parent);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool QSqlRelationalTableModel::removeColumns(int column, int count, const QModelIndex &parent)
{
    Q_D(QSqlRelationalTableModel);

    if (parent.isValid() || column < 0 || column + count > d->rec.count())
        return false;

    for (int i = 0; i < count; ++i) {
        d->baseRec.remove(column);
        if (d->relations.size() > column)
            d->relations.remove(column);
    }
    return QSqlTableModel::removeColumns(column, count, parent);
}